

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_mident_metrics
          (Omega_h *this,Mesh *mesh,Int ent_dim,LOs *entities,Reals *v2m,bool has_degen)

{
  Alloc *pAVar1;
  LO nmetrics;
  uint uVar2;
  ulong uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  Write<int> *this_00;
  Reals RVar5;
  allocator local_141;
  Write<double> local_140;
  Write<int> local_130;
  Write<double> local_120;
  Write<int> local_110;
  Write<double> local_100;
  Write<int> local_f0;
  Write<double> local_e0;
  Write<int> local_d0;
  Write<double> local_c0;
  Write<int> local_b0;
  Write<double> local_a0;
  Write<int> local_90;
  Write<double> local_80;
  Write<int> local_70;
  Write<double> local_60;
  string local_50;
  
  pAVar1 = (entities->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  if ((int)(uVar3 >> 2) == 0) {
    std::__cxx11::string::string((string *)&local_50,"",&local_141);
    Read<double>::Read((Read<double> *)this,(initializer_list<double>)ZEXT816(0),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pvVar4 = extraout_RDX;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    Write<double>::Write(&local_60,&v2m->write_);
    uVar2 = get_metrics_dim(nmetrics,(Reals *)&local_60);
    Write<double>::~Write(&local_60);
    if ((ent_dim ^ 3U) == 0 && (uVar2 ^ 3) == 0) {
      Write<int>::Write(&local_70,&entities->write_);
      Write<double>::Write(&local_80,&v2m->write_);
      get_mident_metrics_tmpl<3,3>(this,mesh,(LOs *)&local_70,(Reals *)&local_80,has_degen);
      Write<double>::~Write(&local_80);
      this_00 = &local_70;
    }
    else if ((uVar2 ^ 3) == 0 && (ent_dim ^ 1U) == 0) {
      Write<int>::Write(&local_90,&entities->write_);
      Write<double>::Write(&local_a0,&v2m->write_);
      get_mident_metrics_tmpl<3,1>(this,mesh,(LOs *)&local_90,(Reals *)&local_a0,has_degen);
      Write<double>::~Write(&local_a0);
      this_00 = &local_90;
    }
    else if ((ent_dim ^ 2U) == 0 && (uVar2 ^ 2) == 0) {
      Write<int>::Write(&local_b0,&entities->write_);
      Write<double>::Write(&local_c0,&v2m->write_);
      get_mident_metrics_tmpl<2,2>(this,mesh,(LOs *)&local_b0,(Reals *)&local_c0,has_degen);
      Write<double>::~Write(&local_c0);
      this_00 = &local_b0;
    }
    else if ((ent_dim ^ 1U) == 0 && (uVar2 ^ 2) == 0) {
      Write<int>::Write(&local_d0,&entities->write_);
      Write<double>::Write(&local_e0,&v2m->write_);
      get_mident_metrics_tmpl<2,1>(this,mesh,(LOs *)&local_d0,(Reals *)&local_e0,has_degen);
      Write<double>::~Write(&local_e0);
      this_00 = &local_d0;
    }
    else if ((ent_dim ^ 3U) == 0 && (uVar2 ^ 1) == 0) {
      Write<int>::Write(&local_f0,&entities->write_);
      Write<double>::Write(&local_100,&v2m->write_);
      get_mident_metrics_tmpl<1,3>(this,mesh,(LOs *)&local_f0,(Reals *)&local_100,has_degen);
      Write<double>::~Write(&local_100);
      this_00 = &local_f0;
    }
    else if ((ent_dim ^ 2U) == 0 && (uVar2 ^ 1) == 0) {
      Write<int>::Write(&local_110,&entities->write_);
      Write<double>::Write(&local_120,&v2m->write_);
      get_mident_metrics_tmpl<1,2>(this,mesh,(LOs *)&local_110,(Reals *)&local_120,has_degen);
      Write<double>::~Write(&local_120);
      this_00 = &local_110;
    }
    else {
      if ((ent_dim != 1) || (uVar2 != 1)) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
             ,0x62);
      }
      Write<int>::Write(&local_130,&entities->write_);
      Write<double>::Write(&local_140,&v2m->write_);
      get_mident_metrics_tmpl<1,1>(this,mesh,(LOs *)&local_130,(Reals *)&local_140,has_degen);
      Write<double>::~Write(&local_140);
      this_00 = &local_130;
    }
    Write<int>::~Write(this_00);
    pvVar4 = extraout_RDX_00;
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics(
    Mesh* mesh, Int ent_dim, LOs entities, Reals v2m, bool has_degen) {
  if (entities.size() == 0) return Reals({});
  auto metrics_dim = get_metrics_dim(mesh->nverts(), v2m);
  if (metrics_dim == 3 && ent_dim == 3) {
    return get_mident_metrics_tmpl<3, 3>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 3 && ent_dim == 1) {
    return get_mident_metrics_tmpl<3, 1>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 2 && ent_dim == 2) {
    return get_mident_metrics_tmpl<2, 2>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 2 && ent_dim == 1) {
    return get_mident_metrics_tmpl<2, 1>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 3) {
    return get_mident_metrics_tmpl<1, 3>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 2) {
    return get_mident_metrics_tmpl<1, 2>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 1) {
    return get_mident_metrics_tmpl<1, 1>(mesh, entities, v2m, has_degen);
  }
  OMEGA_H_NORETURN(Reals());
}